

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void increase_comb_counter_in_groups
               (size_t *ix_arr,size_t st,size_t end,size_t split_ix,size_t n,double *counter,
               double exp_remainder)

{
  difference_type dVar1;
  ulong uVar2;
  long in_RCX;
  long lVar3;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  size_t ix2_1;
  size_t ix1_1;
  size_t ix2;
  size_t ix1;
  size_t n_group;
  size_t *ptr_split_ix;
  undefined8 local_68;
  undefined8 local_60;
  unsigned_long *in_stack_ffffffffffffffa8;
  unsigned_long *in_stack_ffffffffffffffb0;
  ulong uVar4;
  unsigned_long *in_stack_ffffffffffffffb8;
  unsigned_long *in_stack_ffffffffffffffc0;
  
  std::lower_bound<unsigned_long*,unsigned_long>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  dVar1 = std::distance<unsigned_long*>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_60 = in_RSI;
  uVar4 = in_RSI;
  if (1.0 < in_XMM0_Qa) {
    for (; local_60 < in_RSI + dVar1; local_60 = local_60 + 1) {
      for (local_68 = in_RSI + dVar1; local_68 <= in_RDX; local_68 = local_68 + 1) {
        lVar3 = (*(long *)(in_RDI + local_60 * 8) * (in_R8 - in_RCX) +
                *(long *)(in_RDI + local_68 * 8)) - in_RCX;
        *(double *)(in_R9 + lVar3 * 8) = in_XMM0_Qa + *(double *)(in_R9 + lVar3 * 8);
      }
    }
  }
  else {
    for (; uVar4 < in_RSI + dVar1; uVar4 = uVar4 + 1) {
      for (uVar2 = in_RSI + dVar1; uVar2 <= in_RDX; uVar2 = uVar2 + 1) {
        lVar3 = (*(long *)(in_RDI + uVar4 * 8) * (in_R8 - in_RCX) + *(long *)(in_RDI + uVar2 * 8)) -
                in_RCX;
        *(double *)(in_R9 + lVar3 * 8) = *(double *)(in_R9 + lVar3 * 8) + 1.0;
      }
    }
  }
  return;
}

Assistant:

void increase_comb_counter_in_groups(size_t ix_arr[], size_t st, size_t end, size_t split_ix, size_t n,
                                     double counter[], double exp_remainder)
{
    size_t *ptr_split_ix = std::lower_bound(ix_arr + st, ix_arr + end + 1, split_ix);
    size_t n_group = std::distance(ix_arr + st, ptr_split_ix);
    n = n - split_ix;

    if (exp_remainder <= 1)
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix]++;
    else
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix] += exp_remainder;
}